

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::InternReadFile
          (ASEImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  Parser *pPVar1;
  pointer pLVar2;
  pointer pMVar3;
  IOStream *pIVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  Logger *this_00;
  aiMesh **ppaVar7;
  runtime_error *this_01;
  long *plVar8;
  ProgressHandler *pPVar9;
  uint fileFormatDefault;
  const_iterator i;
  undefined1 auVar10 [8];
  pointer pMVar11;
  pointer pLVar12;
  bool bVar13;
  ASEImporter *this_02;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> nodes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  vector<char,_std::allocator<char>_> mBuffer2;
  Parser parser;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> local_178;
  IOStream *local_160;
  undefined1 local_158 [8];
  pointer pLStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Base_ptr local_130;
  pointer local_128;
  pointer local_118;
  undefined1 local_108 [32];
  undefined1 local_e8 [16];
  ProgressHandler local_d8;
  aiScene *paStack_d0;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_c8;
  vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> local_b0;
  vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> local_98;
  vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_> local_80;
  vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> local_68 [2];
  bool bVar14;
  
  local_e8._0_8_ = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"rb","");
  iVar6 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_e8._0_8_);
  local_160 = (IOStream *)CONCAT44(extraout_var,iVar6);
  if ((ProgressHandler *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,(long)local_d8._vptr_ProgressHandler + 1);
  }
  if (local_160 != (IOStream *)0x0) {
    local_108._0_8_ = (char *)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    BaseImporter::TextFileToBuffer
              (local_160,(vector<char,_std::allocator<char>_> *)local_108,FORBID_EMPTY);
    this->mBuffer = (char *)local_108._0_8_;
    this->pcScene = pScene;
    fileFormatDefault = 200;
    if (((pFile->_M_dataplus)._M_p[pFile->_M_string_length - 1] + 0xbdU & 0xdf) == 0) {
      fileFormatDefault = 0x6e;
    }
    ASE::Parser::Parser((Parser *)local_e8,(char *)local_108._0_8_,fileFormatDefault);
    this->mParser = (Parser *)local_e8;
    ASE::Parser::Parse((Parser *)local_e8);
    if ((this->mParser->m_vMeshes).
        super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->mParser->m_vMeshes).
        super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      GenerateDefaultMaterial(this);
      this_02 = (ASEImporter *)local_158;
      local_158 = (undefined1  [8])0x0;
      pLStack_150 = (pointer)0x0;
      local_148._M_allocated_capacity = 0;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_02,
                 ((long)(this->mParser->m_vMeshes).
                        super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mParser->m_vMeshes).
                        super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) * -0x60b60b60b60b60b6);
      pMVar11 = (this->mParser->m_vMeshes).
                super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pMVar11 !=
          (this->mParser->m_vMeshes).
          super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar14 = false;
        bVar13 = false;
        do {
          if (pMVar11->bSkip == false) {
            BuildUniqueRepresentation(this_02,pMVar11);
            bVar5 = GenerateNormals(this,pMVar11);
            bVar13 = bVar14;
            if (bVar5) {
              bVar13 = true;
            }
            this_02 = this;
            ConvertMeshes(this,pMVar11,(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_158);
            bVar14 = bVar13;
          }
          pMVar11 = pMVar11 + 1;
        } while (pMVar11 !=
                 (this->mParser->m_vMeshes).
                 super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        if (bVar13) {
          this_00 = DefaultLogger::get();
          Logger::debug(this_00,
                        "ASE: Taking normals from the file. Use the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you experience problems"
                       );
        }
      }
      auVar10 = local_158;
      pScene->mNumMeshes = (uint)((ulong)((long)pLStack_150 - (long)local_158) >> 3);
      ppaVar7 = (aiMesh **)operator_new__((long)pLStack_150 - (long)local_158 & 0x7fffffff8);
      pScene->mMeshes = ppaVar7;
      for (; auVar10 != (undefined1  [8])pLStack_150;
          auVar10 = (undefined1  [8])&(((pointer)auVar10)->super_BaseNode).mName) {
        if ((*(aiMesh **)&((pointer)auVar10)->super_BaseNode)->mNumFaces != 0) {
          *ppaVar7 = *(aiMesh **)&((pointer)auVar10)->super_BaseNode;
          ppaVar7 = ppaVar7 + 1;
        }
      }
      pScene->mNumMeshes = (uint)((ulong)((long)ppaVar7 - (long)pScene->mMeshes) >> 3);
      BuildMaterialIndices(this);
      if (local_158 != (undefined1  [8])0x0) {
        operator_delete((void *)local_158,local_148._M_allocated_capacity - (long)local_158);
      }
    }
    local_178.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pPVar1 = this->mParser;
    std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::reserve
              (&local_178,
               ((long)(pPVar1->m_vDummies).
                      super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->m_vDummies).
                      super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d +
               ((long)(pPVar1->m_vCameras).
                      super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->m_vCameras).
                      super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5 +
               ((long)(pPVar1->m_vLights).
                      super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->m_vLights).
                      super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x2c8590b21642c859 +
               ((long)(pPVar1->m_vMeshes).
                      super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->m_vMeshes).
                      super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4fa4fa4fa4fa4fa5);
    pLVar12 = (this->mParser->m_vLights).
              super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar2 = (this->mParser->m_vLights).
             super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pLVar12 != pLVar2) {
      do {
        local_158 = (undefined1  [8])pLVar12;
        std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
        emplace_back<Assimp::ASE::BaseNode*>
                  ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)
                   &local_178,(BaseNode **)local_158);
        pLVar12 = pLVar12 + 1;
      } while (pLVar12 != pLVar2);
    }
    pLVar12 = (pointer)(this->mParser->m_vCameras).
                       super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (pointer)(this->mParser->m_vCameras).
                      super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
    if (pLVar12 != pLVar2) {
      do {
        local_158 = (undefined1  [8])pLVar12;
        std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
        emplace_back<Assimp::ASE::BaseNode*>
                  ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)
                   &local_178,(BaseNode **)local_158);
        pLVar12 = (pointer)&pLVar12->mAngle;
      } while (pLVar12 != pLVar2);
    }
    pMVar11 = (this->mParser->m_vMeshes).
              super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar3 = (this->mParser->m_vMeshes).
             super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar11 != pMVar3) {
      do {
        local_158 = (undefined1  [8])&pMVar11->super_BaseNode;
        std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
        emplace_back<Assimp::ASE::BaseNode*>
                  ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)
                   &local_178,(BaseNode **)local_158);
        pMVar11 = pMVar11 + 1;
      } while (pMVar11 != pMVar3);
    }
    pLVar12 = (pointer)(this->mParser->m_vDummies).
                       super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (pointer)(this->mParser->m_vDummies).
                      super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
    if (pLVar12 != pLVar2) {
      do {
        local_158 = (undefined1  [8])pLVar12;
        std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>::
        emplace_back<Assimp::ASE::BaseNode*>
                  ((vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>> *)
                   &local_178,(BaseNode **)local_158);
        pLVar12 = (pointer)&pLVar12->mColor;
      } while (pLVar12 != pLVar2);
    }
    BuildNodes(this,&local_178);
    BuildAnimations(this,&local_178);
    BuildCameras(this);
    BuildLights(this);
    pIVar4 = local_160;
    if ((pScene->mNumMeshes == 0) &&
       (*(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1, this->noSkeletonMesh == false)) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)local_158,pScene,(aiNode *)0x0,false);
      if (local_128 != (pointer)0x0) {
        operator_delete(local_128,(long)local_118 - (long)local_128);
      }
      if ((_Base_ptr)local_148._8_8_ != (_Base_ptr)0x0) {
        operator_delete((void *)local_148._8_8_,(long)local_130 - local_148._8_8_);
      }
      if (local_158 != (undefined1  [8])0x0) {
        operator_delete((void *)local_158,local_148._M_allocated_capacity - (long)local_158);
      }
    }
    if (local_178.
        super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.
                      super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::~vector(local_68);
    std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::~vector(&local_80);
    std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::~vector(&local_98);
    std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::~vector(&local_b0);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_c8);
    if ((char *)local_108._0_8_ != (char *)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    (*pIVar4->_vptr_IOStream[1])(pIVar4);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 "Failed to open ASE file ",pFile);
  plVar8 = (long *)std::__cxx11::string::append(local_158);
  local_e8._0_8_ = *plVar8;
  pPVar9 = (ProgressHandler *)(plVar8 + 2);
  if ((ProgressHandler *)local_e8._0_8_ == pPVar9) {
    local_d8._vptr_ProgressHandler = pPVar9->_vptr_ProgressHandler;
    paStack_d0 = (aiScene *)plVar8[3];
    local_e8._0_8_ = &local_d8;
  }
  else {
    local_d8._vptr_ProgressHandler = pPVar9->_vptr_ProgressHandler;
  }
  local_e8._8_8_ = plVar8[1];
  *plVar8 = (long)pPVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)local_e8);
  *(undefined ***)this_01 = &PTR__runtime_error_007fa260;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ASEImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open ASE file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    this->mBuffer = &mBuffer2[0];
    this->pcScene = pScene;

    // ------------------------------------------------------------------
    // Guess the file format by looking at the extension
    // ASC is considered to be the older format 110,
    // ASE is the actual version 200 (that is currently written by max)
    // ------------------------------------------------------------------
    unsigned int defaultFormat;
    std::string::size_type s = pFile.length()-1;
    switch (pFile.c_str()[s])   {

    case 'C':
    case 'c':
        defaultFormat = AI_ASE_OLD_FILE_FORMAT;
        break;
    default:
        defaultFormat = AI_ASE_NEW_FILE_FORMAT;
    };

    // Construct an ASE parser and parse the file
    ASE::Parser parser(mBuffer,defaultFormat);
    mParser = &parser;
    mParser->Parse();

    //------------------------------------------------------------------
    // Check whether we god at least one mesh. If we did - generate
    // materials and copy meshes.
    // ------------------------------------------------------------------
    if ( !mParser->m_vMeshes.empty())   {

        // If absolutely no material has been loaded from the file
        // we need to generate a default material
        GenerateDefaultMaterial();

        // process all meshes
        bool tookNormals = false;
        std::vector<aiMesh*> avOutMeshes;
        avOutMeshes.reserve(mParser->m_vMeshes.size()*2);
        for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i)    {
            if ((*i).bSkip) {
                continue;
            }
            BuildUniqueRepresentation(*i);

            // Need to generate proper vertex normals if necessary
            if(GenerateNormals(*i)) {
                tookNormals = true;
            }

            // Convert all meshes to aiMesh objects
            ConvertMeshes(*i,avOutMeshes);
        }
        if (tookNormals)    {
            ASSIMP_LOG_DEBUG("ASE: Taking normals from the file. Use "
                "the AI_CONFIG_IMPORT_ASE_RECONSTRUCT_NORMALS setting if you "
                "experience problems");
        }

        // Now build the output mesh list. Remove dummies
        pScene->mNumMeshes = (unsigned int)avOutMeshes.size();
        aiMesh** pp = pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        for (std::vector<aiMesh*>::const_iterator i =  avOutMeshes.begin();i != avOutMeshes.end();++i) {
            if (!(*i)->mNumFaces) {
                continue;
            }
            *pp++ = *i;
        }
        pScene->mNumMeshes = (unsigned int)(pp - pScene->mMeshes);

        // Build final material indices (remove submaterials and setup
        // the final list)
        BuildMaterialIndices();
    }

    // ------------------------------------------------------------------
    // Copy all scene graph nodes - lights, cameras, dummies and meshes
    // into one huge list.
    //------------------------------------------------------------------
    std::vector<BaseNode*> nodes;
    nodes.reserve(mParser->m_vMeshes.size() +mParser->m_vLights.size()
        + mParser->m_vCameras.size() + mParser->m_vDummies.size());

    // Lights
    for (auto &light : mParser->m_vLights)nodes.push_back(&light);
    // Cameras
    for (auto &camera : mParser->m_vCameras)nodes.push_back(&camera);
    // Meshes
    for (auto &mesh : mParser->m_vMeshes)nodes.push_back(&mesh);
    // Dummies
    for (auto &dummy : mParser->m_vDummies)nodes.push_back(&dummy);

    // build the final node graph
    BuildNodes(nodes);

    // build output animations
    BuildAnimations(nodes);

    // build output cameras
    BuildCameras();

    // build output lights
    BuildLights();

    // ------------------------------------------------------------------
    // If we have no meshes use the SkeletonMeshBuilder helper class
    // to build a mesh for the animation skeleton
    // FIXME: very strange results
    // ------------------------------------------------------------------
    if (!pScene->mNumMeshes)    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        if (!noSkeletonMesh) {
            SkeletonMeshBuilder skeleton(pScene);
        }
    }
}